

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdSocket.cpp
# Opt level: O1

function<void_(UdpSocket_*)> * __thiscall
UdpSocketImpl::BindFuncBytesReceived
          (function<void_(UdpSocket_*)> *__return_storage_ptr__,UdpSocketImpl *this,
          function<void_(UdpSocket_*)> *fBytesReceived)

{
  _Manager_type p_Var1;
  _Invoker_type p_Var2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  _Any_data __tmp;
  
  uVar3 = *(undefined8 *)&(this->m_fBytesReceived).super__Function_base._M_functor;
  uVar4 = *(undefined8 *)((long)&(this->m_fBytesReceived).super__Function_base._M_functor + 8);
  uVar5 = *(undefined8 *)((long)&(fBytesReceived->super__Function_base)._M_functor + 8);
  *(undefined8 *)&(this->m_fBytesReceived).super__Function_base._M_functor =
       *(undefined8 *)&(fBytesReceived->super__Function_base)._M_functor;
  *(undefined8 *)((long)&(this->m_fBytesReceived).super__Function_base._M_functor + 8) = uVar5;
  *(undefined8 *)&(fBytesReceived->super__Function_base)._M_functor = uVar3;
  *(undefined8 *)((long)&(fBytesReceived->super__Function_base)._M_functor + 8) = uVar4;
  p_Var1 = (this->m_fBytesReceived).super__Function_base._M_manager;
  (this->m_fBytesReceived).super__Function_base._M_manager =
       (fBytesReceived->super__Function_base)._M_manager;
  (fBytesReceived->super__Function_base)._M_manager = p_Var1;
  p_Var2 = (this->m_fBytesReceived)._M_invoker;
  (this->m_fBytesReceived)._M_invoker = fBytesReceived->_M_invoker;
  fBytesReceived->_M_invoker = p_Var2;
  *(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
  (__return_storage_ptr__->super__Function_base)._M_manager = (_Manager_type)0x0;
  __return_storage_ptr__->_M_invoker = p_Var2;
  p_Var1 = (fBytesReceived->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    uVar3 = *(undefined8 *)((long)&(fBytesReceived->super__Function_base)._M_functor + 8);
    *(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor =
         *(undefined8 *)&(fBytesReceived->super__Function_base)._M_functor;
    *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = uVar3;
    (__return_storage_ptr__->super__Function_base)._M_manager = p_Var1;
    (fBytesReceived->super__Function_base)._M_manager = (_Manager_type)0x0;
    fBytesReceived->_M_invoker = (_Invoker_type)0x0;
  }
  return __return_storage_ptr__;
}

Assistant:

function<void(UdpSocket*)> UdpSocketImpl::BindFuncBytesReceived(function<void(UdpSocket*)> fBytesReceived) noexcept
{
    m_fBytesReceived.swap(fBytesReceived);
    return fBytesReceived;
}